

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cc
# Opt level: O3

void __thiscall avro::MemoryInputStream::skip(MemoryInputStream *this,size_t len)

{
  size_t sVar1;
  ulong uVar2;
  
  if (len != 0) {
    do {
      sVar1 = maxLen(this);
      if (sVar1 == 0) {
        return;
      }
      uVar2 = len + this->curLen_;
      if (uVar2 < sVar1) {
        sVar1 = uVar2;
      }
      this->curLen_ = sVar1;
      len = uVar2 - sVar1;
    } while (len != 0);
  }
  return;
}

Assistant:

void skip(size_t len) {
        while (len > 0) {
            if (size_t n = maxLen()) {
                if ((curLen_ + len) < n) {
                    n = curLen_ + len;
                }
                len -= n - curLen_;
                curLen_ = n;
            } else {
                break;
            }
        }
    }